

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getEdgeId(RDL_data *data,uint from,uint to)

{
  uint to_local;
  uint from_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    data_local._4_4_ = 0xffffffff;
  }
  else if (data->graph == (RDL_graph *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_graph is NULL!\n");
    data_local._4_4_ = 0xffffffff;
  }
  else if ((from < data->graph->V) && (to < data->graph->V)) {
    data_local._4_4_ = RDL_edgeId(data->graph,from,to);
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"invalid edge %u %u\n",(ulong)from,(ulong)to);
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getEdgeId(const RDL_data *data, unsigned from, unsigned to)
{
  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    return RDL_INVALID_RESULT;
  }

  if (!data->graph) {
    RDL_outputFunc(RDL_ERROR, "RDL_graph is NULL!\n");
    return RDL_INVALID_RESULT;
  }

  if (from >= data->graph->V || to >= data->graph->V) {
    RDL_outputFunc(RDL_ERROR, "invalid edge %u %u\n", from, to);
    return RDL_INVALID_RESULT;
  }

  return RDL_edgeId(data->graph, from, to);
}